

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O2

UBool utm_hasCapacity(UToolMemory *mem,int32_t capacity)

{
  int iVar1;
  int iVar2;
  UBool in_AL;
  void *pvVar3;
  size_t s;
  
  iVar1 = mem->capacity;
  if (capacity <= iVar1) {
    return in_AL;
  }
  iVar2 = mem->maxCapacity;
  if (iVar2 < capacity) {
    fprintf(_stderr,"error: %s - trying to use more than maxCapacity=%ld units\n",mem);
  }
  else {
    if ((capacity < iVar1 * 2) && (capacity = iVar1 * 2, iVar2 / 3 < iVar1)) {
      capacity = iVar2;
    }
    s = (long)capacity * (long)mem->size;
    if ((UAlignedMemory *)mem->array == mem->staticArray) {
      pvVar3 = uprv_malloc_63(s);
      mem->array = pvVar3;
      if (pvVar3 != (void *)0x0) {
        pvVar3 = memcpy(pvVar3,mem->staticArray,(long)mem->size * (long)mem->idx);
        goto LAB_001e4730;
      }
    }
    else {
      pvVar3 = uprv_realloc_63(mem->array,s);
      mem->array = pvVar3;
      if (pvVar3 != (void *)0x0) {
LAB_001e4730:
        mem->capacity = capacity;
        return (UBool)pvVar3;
      }
    }
    fprintf(_stderr,"error: %s - out of memory\n",mem);
  }
  exit(7);
}

Assistant:

static UBool
utm_hasCapacity(UToolMemory *mem, int32_t capacity) {
    if(mem->capacity<capacity) {
        int32_t newCapacity;

        if(mem->maxCapacity<capacity) {
            fprintf(stderr, "error: %s - trying to use more than maxCapacity=%ld units\n",
                    mem->name, (long)mem->maxCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        /* try to allocate a larger array */
        if(capacity>=2*mem->capacity) {
            newCapacity=capacity;
        } else if(mem->capacity<=mem->maxCapacity/3) {
            newCapacity=2*mem->capacity;
        } else {
            newCapacity=mem->maxCapacity;
        }

        if(mem->array==mem->staticArray) {
            mem->array=uprv_malloc(newCapacity*mem->size);
            if(mem->array!=NULL) {
                uprv_memcpy(mem->array, mem->staticArray, (size_t)mem->idx*mem->size);
            }
        } else {
            mem->array=uprv_realloc(mem->array, newCapacity*mem->size);
        }

        if(mem->array==NULL) {
            fprintf(stderr, "error: %s - out of memory\n", mem->name);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        mem->capacity=newCapacity;
    }

    return TRUE;
}